

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_Destroy(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  undefined8 uVar1;
  uint uVar2;
  int local_c4;
  bool local_aa;
  bool local_a9;
  int local_a4;
  bool local_89;
  TAngle<double> local_88;
  FName local_80;
  TFlags<ActorFlag,_unsigned_int> local_7c;
  AActor *local_78;
  AActor *temp_1;
  FActorIterator iterator_1;
  FName local_58;
  TFlags<ActorFlag,_unsigned_int> local_54;
  AActor *local_50;
  AActor *temp;
  TThinkerIterator<AActor> iterator;
  AActor *actor;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if ((arg0 == 0) && (arg2 == 0)) {
    P_Massacre();
  }
  else if (arg0 == 0) {
    TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&temp,0x80);
    iterator.super_FThinkerIterator._16_8_ =
         TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&temp,false);
    while (iterator.super_FThinkerIterator._16_8_ != 0) {
      local_50 = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&temp,false);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_54,
                 iterator.super_FThinkerIterator._16_4_ +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
      local_89 = false;
      if (uVar2 != 0) {
        local_89 = FTagManager::SectorHasTag
                             (&tagManager,
                              *(sector_t **)(iterator.super_FThinkerIterator._16_8_ + 0x130),arg2);
      }
      uVar1 = iterator.super_FThinkerIterator._16_8_;
      if (local_89 != false) {
        if (arg1 == 0) {
          local_a4 = *(int *)(iterator.super_FThinkerIterator._16_8_ + 0x1fc);
        }
        else {
          local_a4 = 1000000;
        }
        FName::FName(&local_58,NAME_None);
        TAngle<double>::TAngle((TAngle<double> *)&iterator_1.id,0.0);
        P_DamageMobj((AActor *)uVar1,(AActor *)0x0,it,local_a4,&local_58,0,(DAngle *)&iterator_1.id)
        ;
      }
      iterator.super_FThinkerIterator._16_8_ = local_50;
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)&temp_1,arg0);
    iterator.super_FThinkerIterator._16_8_ = FActorIterator::Next((FActorIterator *)&temp_1);
    while (iterator.super_FThinkerIterator._16_8_ != 0) {
      local_78 = FActorIterator::Next((FActorIterator *)&temp_1);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_7c,
                 iterator.super_FThinkerIterator._16_4_ +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_7c);
      local_a9 = false;
      if (uVar2 != 0) {
        local_aa = true;
        if (arg2 != 0) {
          local_aa = FTagManager::SectorHasTag
                               (&tagManager,
                                *(sector_t **)(iterator.super_FThinkerIterator._16_8_ + 0x130),arg2)
          ;
        }
        local_a9 = local_aa;
      }
      uVar1 = iterator.super_FThinkerIterator._16_8_;
      if (local_a9 != false) {
        if (arg1 == 0) {
          local_c4 = *(int *)(iterator.super_FThinkerIterator._16_8_ + 0x1fc);
        }
        else {
          local_c4 = 1000000;
        }
        FName::FName(&local_80,NAME_None);
        TAngle<double>::TAngle(&local_88,0.0);
        P_DamageMobj((AActor *)uVar1,(AActor *)0x0,it,local_c4,&local_80,0,&local_88);
      }
      iterator.super_FThinkerIterator._16_8_ = local_78;
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_Destroy)
// Thing_Destroy (tid, extreme, tag)
{
	AActor *actor;

	if (arg0 == 0 && arg2 == 0)
	{
		P_Massacre ();
	}
	else if (arg0 == 0)
	{
		TThinkerIterator<AActor> iterator;
		
		actor = iterator.Next ();
		while (actor)
		{
			AActor *temp = iterator.Next ();
			if (actor->flags & MF_SHOOTABLE && tagManager.SectorHasTag(actor->Sector, arg2))
				P_DamageMobj (actor, NULL, it, arg1 ? TELEFRAG_DAMAGE : actor->health, NAME_None);
			actor = temp;
		}
	}
	else
	{
		FActorIterator iterator (arg0);

		actor = iterator.Next ();
		while (actor)
		{
			AActor *temp = iterator.Next ();
			if (actor->flags & MF_SHOOTABLE && (arg2 == 0 || tagManager.SectorHasTag(actor->Sector, arg2)))
				P_DamageMobj (actor, NULL, it, arg1 ? TELEFRAG_DAMAGE : actor->health, NAME_None);
			actor = temp;
		}
	}
	return true;
}